

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O3

TokenKind slang::syntax::SyntaxFacts::getModuleEndKind(TokenKind kind)

{
  TokenKind TVar1;
  undefined2 in_register_0000003a;
  int iVar2;
  
  iVar2 = CONCAT22(in_register_0000003a,kind);
  TVar1 = EndModuleKeyword;
  if (iVar2 < 0xda) {
    if (iVar2 == 0xc9) {
      return EndInterfaceKeyword;
    }
    if (iVar2 != 0xd6) {
      return Unknown;
    }
  }
  else if (iVar2 != 0xda) {
    if (iVar2 == 0xe9) {
      return EndPackageKeyword;
    }
    if (iVar2 != 0xf0) {
      return Unknown;
    }
    TVar1 = EndProgramKeyword;
  }
  return TVar1;
}

Assistant:

parsing::TokenKind SyntaxFacts::getModuleEndKind(TokenKind kind) {
    switch (kind) {
        case TokenKind::ModuleKeyword: return TokenKind::EndModuleKeyword;
        case TokenKind::MacromoduleKeyword: return TokenKind::EndModuleKeyword;
        case TokenKind::ProgramKeyword: return TokenKind::EndProgramKeyword;
        case TokenKind::InterfaceKeyword: return TokenKind::EndInterfaceKeyword;
        case TokenKind::PackageKeyword: return TokenKind::EndPackageKeyword;
        default: return TokenKind::Unknown;
    }
}